

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O3

BindingAlias * __thiscall
duckdb::Binder::FindBinding
          (BindingAlias *__return_storage_ptr__,Binder *this,string *using_column,string *join_side)

{
  pointer pcVar1;
  bool bVar2;
  BinderException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BindingAlias::BindingAlias(__return_storage_ptr__);
  bVar2 = TryFindBinding(this,using_column,join_side,__return_storage_ptr__);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Column \"%s\" does not exist on %s side of join!","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (using_column->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + using_column->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (join_side->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + join_side->_M_string_length);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_70,&local_50,&local_90);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindingAlias Binder::FindBinding(const string &using_column, const string &join_side) {
	BindingAlias result;
	if (!TryFindBinding(using_column, join_side, result)) {
		throw BinderException("Column \"%s\" does not exist on %s side of join!", using_column, join_side);
	}
	return result;
}